

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

FIOBJ fiobj_data_slice(FIOBJ parent,intptr_t offset,uintptr_t length)

{
  int *piVar1;
  intptr_t iVar2;
  ulong uVar3;
  FIOBJ FVar4;
  ulong uVar5;
  ulong uVar6;
  uintptr_t uVar7;
  
  if (offset < 0) {
    iVar2 = fiobj_data_len(parent);
    offset = offset + iVar2 + 1;
  }
  uVar5 = 0;
  if (0 < offset) {
    uVar5 = offset;
  }
  for (; *(int *)(parent + 0x30) == -2; parent = *(FIOBJ *)(parent + 0x10)) {
    uVar5 = uVar5 + *(long *)(parent + 0x18);
  }
  uVar3 = fiobj_data_len(parent);
  uVar6 = uVar5;
  if (uVar3 < uVar5) {
    uVar6 = uVar3;
  }
  uVar7 = uVar3 - uVar5;
  if (uVar5 + length <= uVar3) {
    uVar7 = length;
  }
  if (uVar3 <= uVar5) {
    uVar7 = 0;
  }
  FVar4 = fiobj_data_alloc((void *)0x0,-2);
  *(ulong *)(FVar4 + 0x18) = uVar6;
  *(uintptr_t *)(FVar4 + 0x20) = uVar7;
  if ((((~(uint)parent & 6) != 0) && (parent != 0)) && ((parent & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((parent & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  *(FIOBJ *)(FVar4 + 0x10) = parent;
  return FVar4;
}

Assistant:

FIOBJ fiobj_data_slice(FIOBJ parent, intptr_t offset, uintptr_t length) {
  /* cut from the end */
  if (offset < 0) {
    size_t parent_len = fiobj_data_len(parent);
    offset = parent_len + 1 + offset;
  }
  if (offset < 0)
    offset = 0;
  while (obj2io(parent)->fd == -2) {
    /* don't slice a slice... climb the parent chain. */
    offset += obj2io(parent)->capa;
    parent = obj2io(parent)->source.parent;
  }
  size_t parent_len = fiobj_data_len(parent);
  if (parent_len <= (size_t)offset) {
    length = 0;
    offset = parent_len;
  } else if (parent_len < offset + length) {
    length = parent_len - offset;
  }
  /* make the object */
  FIOBJ o = fiobj_data_alloc(NULL, -2);
  obj2io(o)->capa = offset;
  obj2io(o)->len = length;
  obj2io(o)->source.parent = fiobj_dup(parent);
  return o;
}